

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O2

void __thiscall sznet::net::Acceptor::~Acceptor(Acceptor *this)

{
  Channel *this_00;
  char *in_RSI;
  
  this_00 = &this->m_acceptChannel;
  Channel::disableAll(this_00);
  Channel::remove(this_00,in_RSI);
  sockets::sz_closesocket(this->m_idleFd);
  std::_Function_base::~_Function_base(&(this->m_newConnectionCallback).super__Function_base);
  Channel::~Channel(this_00);
  Socket::~Socket(&this->m_acceptSocket);
  return;
}

Assistant:

Acceptor::~Acceptor()
{
	m_acceptChannel.disableAll();
	m_acceptChannel.remove();
	sockets::sz_closesocket(m_idleFd);
}